

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  int iVar1;
  long lVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  lVar2 = 8;
  do {
    if (*(int *)((long)&__dso_handle + lVar2) == sig) {
      std::__cxx11::string::string
                ((string *)local_30,*(char **)((long)&signalDefs + lVar2),&local_31);
      pIVar3 = getCurrentMutableContext();
      iVar1 = (*(pIVar3->super_IContext)._vptr_IContext[2])(pIVar3);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x50))
                ((long *)CONCAT44(extraout_var_00,iVar1),local_30);
      goto LAB_0013dafd;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"<unknown signal>","");
  pIVar3 = getCurrentMutableContext();
  iVar1 = (*(pIVar3->super_IContext)._vptr_IContext[2])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
            ((long *)CONCAT44(extraout_var,iVar1),local_30);
LAB_0013dafd:
  exit(-sig);
}

Assistant:

static void handleSignal( int sig ) {
            for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i )
                if( sig == signalDefs[i].id )
                    fatal( signalDefs[i].name, -sig );
            fatal( "<unknown signal>", -sig );
        }